

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O1

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>>::X<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>> *this,
          TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  void *pvVar6;
  Fad<double> *pFVar7;
  ulong uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  int i_1;
  double dVar13;
  TPZManVector<Fad<double>,_3> Xsphere;
  TPZManVector<Fad<double>,_3> XtminusXc;
  TPZManVector<Fad<double>,_3> xqsi;
  Fad<double> local_260;
  Fad<double> local_240;
  TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>> *local_220;
  TPZVec<Fad<double>_> *local_218;
  TPZManVector<double,_3> local_210;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_1d8;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_1c8;
  TPZManVector<Fad<double>,_3> local_1b0;
  TPZManVector<Fad<double>,_3> local_130;
  TPZManVector<Fad<double>,_3> local_b0;
  
  local_130.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_130.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_130.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_130.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  local_218 = result;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,3,(Fad<double> *)&local_130);
  Fad<double>::~Fad((Fad<double> *)&local_130);
  local_1b0.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_1b0.super_TPZVec<Fad<double>_>.fStore =
       (Fad<double> *)((ulong)local_1b0.super_TPZVec<Fad<double>_>.fStore._4_4_ << 0x20);
  local_1b0.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_1b0.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_130,3,(Fad<double> *)&local_1b0);
  Fad<double>::~Fad((Fad<double> *)&local_1b0);
  TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoTriangle> *)this,cornerco,loc,
             &local_b0.super_TPZVec<Fad<double>_>);
  local_210.super_TPZVec<double>.fStore = (double *)0x0;
  local_210.super_TPZVec<double>.fNElements = 0;
  local_210.super_TPZVec<double>.fNAlloc = 0;
  local_210.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar10 = *(ulong *)(this + 0x8d0);
  if ((long)uVar10 < 4) {
    local_210.super_TPZVec<double>.fStore = local_210.fExtAlloc;
    local_210.super_TPZVec<double>.fNAlloc = 0;
  }
  else {
    local_210.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
    local_210.super_TPZVec<double>.fNAlloc = uVar10;
  }
  if (0 < (long)uVar10) {
    lVar9 = *(long *)(this + 0x8c8);
    uVar8 = 0;
    do {
      local_210.super_TPZVec<double>.fStore[uVar8] = *(double *)(lVar9 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  local_260.val_ = 0.0;
  local_260.dx_.num_elts = 0;
  local_260.dx_.ptr_to_data = (double *)0x0;
  local_260.defaultVal = 0.0;
  lVar9 = 0;
  local_220 = this;
  local_210.super_TPZVec<double>.fNElements = uVar10;
  do {
    pFVar7 = local_b0.super_TPZVec<Fad<double>_>.fStore;
    lVar11 = lVar9 * 0x20;
    dVar1 = local_210.super_TPZVec<double>.fStore[lVar9];
    uVar2 = local_b0.super_TPZVec<Fad<double>_>.fStore[lVar9].dx_.num_elts;
    uVar3 = *(uint *)(CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                               local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + 8 + lVar11);
    pdVar12 = (double *)
              (CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar11);
    if (uVar2 != uVar3) {
      if (uVar2 == 0) {
        if (uVar3 != 0) {
          if ((void *)pdVar12[2] != (void *)0x0) {
            operator_delete__((void *)pdVar12[2]);
          }
          *(undefined4 *)(pdVar12 + 1) = 0;
          pdVar12[2] = 0.0;
        }
      }
      else {
        if (uVar3 != 0) {
          if ((void *)pdVar12[2] != (void *)0x0) {
            operator_delete__((void *)pdVar12[2]);
          }
          *(undefined4 *)(pdVar12 + 1) = 0;
          pdVar12[2] = 0.0;
        }
        *(uint *)(pdVar12 + 1) = uVar2;
        uVar10 = (long)(int)uVar2 << 3;
        if ((int)uVar2 < 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pvVar6 = operator_new__(uVar10);
        pdVar12[2] = (double)pvVar6;
      }
    }
    pFVar7 = pFVar7 + lVar9;
    if (uVar2 != 0) {
      dVar13 = pdVar12[2];
      if ((pFVar7->dx_).num_elts == 0) {
        if (0 < (int)uVar2) {
          uVar10 = 0;
          do {
            *(double *)((long)dVar13 + uVar10 * 8) = pFVar7->defaultVal;
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
        }
      }
      else if (0 < (int)uVar2) {
        pdVar4 = (pFVar7->dx_).ptr_to_data;
        uVar10 = 0;
        do {
          *(double *)((long)dVar13 + uVar10 * 8) = pdVar4[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
    }
    *pdVar12 = pFVar7->val_ - dVar1;
    local_1b0.super_TPZVec<Fad<double>_>._vptr_TPZVec =
         (_func_int **)
         (lVar11 + CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                            local_130.super_TPZVec<Fad<double>_>.fStore._0_4_));
    local_1b0.super_TPZVec<Fad<double>_>.fStore =
         (Fad<double> *)local_1b0.super_TPZVec<Fad<double>_>._vptr_TPZVec;
    Fad<double>::operator+=
              (&local_260,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_1b0);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)&local_240,&local_260);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&local_1b0,
             (FadFuncSqrt<Fad<double>_> *)&local_240);
  Fad<double>::~Fad(&local_240);
  iVar5 = (int)local_1b0.super_TPZVec<Fad<double>_>.fNElements;
  uVar10 = local_1b0.super_TPZVec<Fad<double>_>.fNElements & 0xffffffff;
  if ((int)local_1b0.super_TPZVec<Fad<double>_>.fNElements != local_260.dx_.num_elts) {
    if ((int)local_1b0.super_TPZVec<Fad<double>_>.fNElements == 0) {
      if (local_260.dx_.num_elts != 0) {
        if (local_260.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_260.dx_.ptr_to_data);
        }
        local_260.dx_.num_elts = 0;
        local_260.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      lVar9 = (long)(int)local_1b0.super_TPZVec<Fad<double>_>.fNElements;
      if (local_260.dx_.num_elts != 0) {
        if (local_260.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_260.dx_.ptr_to_data);
        }
        local_260.dx_.ptr_to_data = (double *)0x0;
      }
      local_260.dx_.num_elts = iVar5;
      uVar8 = 0xffffffffffffffff;
      if (-1 < iVar5) {
        uVar8 = lVar9 << 3;
      }
      local_260.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    }
  }
  pdVar12 = local_260.dx_.ptr_to_data;
  if (iVar5 != 0) {
    if ((int)local_1b0.super_TPZVec<Fad<double>_>.fNElements == 0) {
      if (0 < iVar5) {
        lVar9 = 0;
        do {
          pFVar7 = (Fad<double> *)(local_1b0.super_TPZVec<Fad<double>_>.fNAlloc + lVar9);
          if ((int)local_1b0.super_TPZVec<Fad<double>_>.fNElements == 0) {
            pFVar7 = local_1b0.fExtAlloc;
          }
          dVar1 = pFVar7->val_;
          if ((double)local_1b0.super_TPZVec<Fad<double>_>.fStore < 0.0) {
            dVar13 = sqrt((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
          }
          else {
            dVar13 = SQRT((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
          }
          *(double *)((long)pdVar12 + lVar9) = dVar1 / (dVar13 + dVar13);
          lVar9 = lVar9 + 8;
        } while (uVar10 * 8 - lVar9 != 0);
      }
    }
    else if (0 < iVar5) {
      uVar8 = 0;
      do {
        dVar1 = *(double *)(local_1b0.super_TPZVec<Fad<double>_>.fNAlloc + uVar8 * 8);
        if ((double)local_1b0.super_TPZVec<Fad<double>_>.fStore < 0.0) {
          dVar13 = sqrt((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
        }
        else {
          dVar13 = SQRT((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
        }
        pdVar12[uVar8] = dVar1 / (dVar13 + dVar13);
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  if ((double)local_1b0.super_TPZVec<Fad<double>_>.fStore < 0.0) {
    local_260.val_ = sqrt((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
  }
  else {
    local_260.val_ = SQRT((double)local_1b0.super_TPZVec<Fad<double>_>.fStore);
  }
  Fad<double>::~Fad((Fad<double> *)&local_1b0.super_TPZVec<Fad<double>_>.fStore);
  local_240.val_ = 0.0;
  local_240.dx_._0_8_ = (ulong)(uint)local_240.dx_._4_4_ << 0x20;
  local_240.dx_.ptr_to_data = (double *)0x0;
  local_240.defaultVal = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_1b0,3,&local_240);
  Fad<double>::~Fad(&local_240);
  lVar9 = 0;
  lVar11 = 0;
  do {
    local_240.dx_._0_8_ = *(undefined8 *)(local_220 + 0x8e0);
    local_240.dx_.ptr_to_data = (double *)0x0;
    local_240.defaultVal = (double)&local_260;
    local_1d8.fadexpr_.right_ =
         (Fad<double> *)
         (CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                   local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar9);
    local_1c8.fadexpr_.right_.constant_ = local_210.super_TPZVec<double>.fStore[lVar11];
    local_1c8.fadexpr_.right_.defaultVal = 0.0;
    local_1d8.fadexpr_.left_ = (FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)&local_240;
    local_1c8.fadexpr_.left_ = &local_1d8;
    Fad<double>::operator=((Fad<double> *)((long)&local_218->fStore->val_ + lVar9),&local_1c8);
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x20;
  } while (lVar11 != 3);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_1b0);
  Fad<double>::~Fad(&local_260);
  TPZManVector<double,_3>::~TPZManVector(&local_210);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_130);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }